

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O3

string * __thiscall test_pool2d::vars_abi_cxx11_(string *__return_storage_ptr__,test_pool2d *this)

{
  size_type *psVar1;
  ggml_op_pool gVar2;
  undefined8 uVar3;
  uint uVar4;
  long *plVar5;
  char *__s;
  undefined8 *puVar6;
  uint uVar7;
  long *plVar8;
  ulong *puVar9;
  ulong uVar10;
  ggml_op_pool __val;
  uint __len;
  string __str;
  undefined4 *local_450;
  undefined8 local_448;
  undefined4 local_440;
  undefined4 uStack_43c;
  ulong *local_430;
  long local_428;
  ulong local_420;
  long lStack_418;
  ulong *local_410;
  long local_408;
  ulong local_400;
  long lStack_3f8;
  ulong *local_3f0;
  long local_3e8;
  ulong local_3e0;
  long lStack_3d8;
  ulong *local_3d0;
  long local_3c8;
  ulong local_3c0;
  long lStack_3b8;
  ulong *local_3b0;
  long local_3a8;
  ulong local_3a0;
  long lStack_398;
  ulong *local_390;
  long local_388;
  ulong local_380;
  undefined4 uStack_378;
  undefined4 uStack_374;
  ulong *local_370;
  long local_368;
  ulong local_360;
  long lStack_358;
  ulong *local_350;
  long local_348;
  ulong local_340;
  long lStack_338;
  ulong *local_330;
  long local_328;
  ulong local_320;
  long lStack_318;
  ulong *local_310;
  long local_308;
  ulong local_300;
  long lStack_2f8;
  long *local_2f0;
  undefined8 local_2e8;
  long local_2e0;
  undefined8 uStack_2d8;
  long *local_2d0;
  undefined8 local_2c8;
  long local_2c0;
  undefined8 uStack_2b8;
  long *local_2b0;
  undefined8 local_2a8;
  long local_2a0;
  undefined8 uStack_298;
  long *local_290;
  undefined8 local_288;
  long local_280;
  undefined8 uStack_278;
  long *local_270;
  undefined8 local_268;
  long local_260;
  undefined8 uStack_258;
  long *local_250;
  undefined8 local_248;
  long local_240;
  undefined8 uStack_238;
  long *local_230;
  undefined8 local_228;
  long local_220;
  undefined8 uStack_218;
  ulong *local_210;
  long local_208;
  ulong local_200;
  long lStack_1f8;
  ulong *local_1f0;
  long local_1e8;
  ulong local_1e0;
  long lStack_1d8;
  ulong *local_1d0;
  long local_1c8;
  ulong local_1c0;
  long lStack_1b8;
  ulong *local_1b0;
  long local_1a8;
  ulong local_1a0;
  long lStack_198;
  ulong *local_190;
  long local_188;
  ulong local_180;
  long lStack_178;
  ulong *local_170;
  long local_168;
  ulong local_160;
  long lStack_158;
  long *local_150;
  long local_148;
  long local_140;
  long lStack_138;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  gVar2 = this->pool_type;
  if (gVar2 == GGML_OP_POOL_MAX) {
    local_440 = 0x78616d;
LAB_00120d96:
    local_450 = &local_440;
    local_448 = 3;
  }
  else {
    if (gVar2 == GGML_OP_POOL_AVG) {
      local_440 = 0x677661;
      goto LAB_00120d96;
    }
    __val = -gVar2;
    if (0 < (int)gVar2) {
      __val = gVar2;
    }
    __len = 1;
    if (9 < __val) {
      uVar10 = (ulong)__val;
      uVar4 = 4;
      do {
        __len = uVar4;
        uVar7 = (uint)uVar10;
        if (uVar7 < 100) {
          __len = __len - 2;
          goto LAB_00120e01;
        }
        if (uVar7 < 1000) {
          __len = __len - 1;
          goto LAB_00120e01;
        }
        if (uVar7 < 10000) goto LAB_00120e01;
        uVar10 = uVar10 / 10000;
        uVar4 = __len + 4;
      } while (99999 < uVar7);
      __len = __len + 1;
    }
LAB_00120e01:
    local_450 = &local_440;
    std::__cxx11::string::_M_construct((ulong)&local_450,(char)__len - (char)((int)gVar2 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)local_450 + (ulong)(gVar2 >> 0x1f)),__len,__val);
  }
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_450,0,(char *)0x0,0x158cd4);
  local_150 = &local_140;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_140 = *plVar8;
    lStack_138 = plVar5[3];
  }
  else {
    local_140 = *plVar8;
    local_150 = (long *)*plVar5;
  }
  local_148 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_150);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_380 = *puVar9;
    uStack_378 = (undefined4)plVar5[3];
    uStack_374 = *(undefined4 *)((long)plVar5 + 0x1c);
    local_390 = &local_380;
  }
  else {
    local_380 = *puVar9;
    local_390 = (ulong *)*plVar5;
  }
  local_388 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  __s = (char *)ggml_type_name(this->type_input);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,__s,(allocator<char> *)&local_430);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x158cdf);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_3a0 = *puVar9;
    lStack_398 = plVar5[3];
    local_3b0 = &local_3a0;
  }
  else {
    local_3a0 = *puVar9;
    local_3b0 = (ulong *)*plVar5;
  }
  local_3a8 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  uVar10 = 0xf;
  if (local_390 != &local_380) {
    uVar10 = local_380;
  }
  if (uVar10 < (ulong)(local_3a8 + local_388)) {
    uVar10 = 0xf;
    if (local_3b0 != &local_3a0) {
      uVar10 = local_3a0;
    }
    if (uVar10 < (ulong)(local_3a8 + local_388)) goto LAB_00120fe5;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_3b0,0,(char *)0x0,(ulong)local_390);
  }
  else {
LAB_00120fe5:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_390,(ulong)local_3b0);
  }
  local_2f0 = &local_2e0;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_2e0 = *plVar5;
    uStack_2d8 = puVar6[3];
  }
  else {
    local_2e0 = *plVar5;
    local_2f0 = (long *)*puVar6;
  }
  local_2e8 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_2f0);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_360 = *puVar9;
    lStack_358 = plVar5[3];
    local_370 = &local_360;
  }
  else {
    local_360 = *puVar9;
    local_370 = (ulong *)*plVar5;
  }
  local_368 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  var_to_str<long,4ul>(&local_70,&this->ne_input);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x158ceb);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_420 = *puVar9;
    lStack_418 = plVar5[3];
    local_430 = &local_420;
  }
  else {
    local_420 = *puVar9;
    local_430 = (ulong *)*plVar5;
  }
  local_428 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  uVar10 = 0xf;
  if (local_370 != &local_360) {
    uVar10 = local_360;
  }
  if (uVar10 < (ulong)(local_428 + local_368)) {
    uVar10 = 0xf;
    if (local_430 != &local_420) {
      uVar10 = local_420;
    }
    if (uVar10 < (ulong)(local_428 + local_368)) goto LAB_0012117c;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_430,0,(char *)0x0,(ulong)local_370);
  }
  else {
LAB_0012117c:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_370,(ulong)local_430);
  }
  local_2d0 = &local_2c0;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_2c0 = *plVar5;
    uStack_2b8 = puVar6[3];
  }
  else {
    local_2c0 = *plVar5;
    local_2d0 = (long *)*puVar6;
  }
  local_2c8 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_2d0);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_340 = *puVar9;
    lStack_338 = plVar5[3];
    local_350 = &local_340;
  }
  else {
    local_340 = *puVar9;
    local_350 = (ulong *)*plVar5;
  }
  local_348 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  var_to_str<int>(&local_90,(int *)(ulong)(uint)this->k0);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,0x158cf5);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_3c0 = *puVar9;
    lStack_3b8 = plVar5[3];
    local_3d0 = &local_3c0;
  }
  else {
    local_3c0 = *puVar9;
    local_3d0 = (ulong *)*plVar5;
  }
  local_3c8 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  uVar10 = 0xf;
  if (local_350 != &local_340) {
    uVar10 = local_340;
  }
  if (uVar10 < (ulong)(local_3c8 + local_348)) {
    uVar10 = 0xf;
    if (local_3d0 != &local_3c0) {
      uVar10 = local_3c0;
    }
    if (uVar10 < (ulong)(local_3c8 + local_348)) goto LAB_00121325;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_3d0,0,(char *)0x0,(ulong)local_350);
  }
  else {
LAB_00121325:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_350,(ulong)local_3d0);
  }
  local_2b0 = &local_2a0;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_2a0 = *plVar5;
    uStack_298 = puVar6[3];
  }
  else {
    local_2a0 = *plVar5;
    local_2b0 = (long *)*puVar6;
  }
  local_2a8 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_2b0);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_320 = *puVar9;
    lStack_318 = plVar5[3];
    local_330 = &local_320;
  }
  else {
    local_320 = *puVar9;
    local_330 = (ulong *)*plVar5;
  }
  local_328 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  var_to_str<int>(&local_b0,(int *)(ulong)(uint)this->k1);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x158cf9);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_3e0 = *puVar9;
    lStack_3d8 = plVar5[3];
    local_3f0 = &local_3e0;
  }
  else {
    local_3e0 = *puVar9;
    local_3f0 = (ulong *)*plVar5;
  }
  local_3e8 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  uVar10 = 0xf;
  if (local_330 != &local_320) {
    uVar10 = local_320;
  }
  if (uVar10 < (ulong)(local_3e8 + local_328)) {
    uVar10 = 0xf;
    if (local_3f0 != &local_3e0) {
      uVar10 = local_3e0;
    }
    if (uVar10 < (ulong)(local_3e8 + local_328)) goto LAB_001214bc;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_3f0,0,(char *)0x0,(ulong)local_330);
  }
  else {
LAB_001214bc:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_330,(ulong)local_3f0);
  }
  local_290 = &local_280;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_280 = *plVar5;
    uStack_278 = puVar6[3];
  }
  else {
    local_280 = *plVar5;
    local_290 = (long *)*puVar6;
  }
  local_288 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_290);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_300 = *puVar9;
    lStack_2f8 = plVar5[3];
    local_310 = &local_300;
  }
  else {
    local_300 = *puVar9;
    local_310 = (ulong *)*plVar5;
  }
  local_308 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  var_to_str<int>(&local_d0,(int *)(ulong)(uint)this->s0);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,0x158cfd);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_400 = *puVar9;
    lStack_3f8 = plVar5[3];
    local_410 = &local_400;
  }
  else {
    local_400 = *puVar9;
    local_410 = (ulong *)*plVar5;
  }
  local_408 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  uVar10 = 0xf;
  if (local_310 != &local_300) {
    uVar10 = local_300;
  }
  if (uVar10 < (ulong)(local_408 + local_308)) {
    uVar10 = 0xf;
    if (local_410 != &local_400) {
      uVar10 = local_400;
    }
    if (uVar10 < (ulong)(local_408 + local_308)) goto LAB_00121656;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_410,0,(char *)0x0,(ulong)local_310);
  }
  else {
LAB_00121656:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_310,(ulong)local_410);
  }
  local_270 = &local_260;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_260 = *plVar5;
    uStack_258 = puVar6[3];
  }
  else {
    local_260 = *plVar5;
    local_270 = (long *)*puVar6;
  }
  local_268 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_270);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_1a0 = *puVar9;
    lStack_198 = plVar5[3];
    local_1b0 = &local_1a0;
  }
  else {
    local_1a0 = *puVar9;
    local_1b0 = (ulong *)*plVar5;
  }
  local_1a8 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  var_to_str<int>(&local_f0,(int *)(ulong)(uint)this->s1);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,0x158d01);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_1c0 = *puVar9;
    lStack_1b8 = plVar5[3];
    local_1d0 = &local_1c0;
  }
  else {
    local_1c0 = *puVar9;
    local_1d0 = (ulong *)*plVar5;
  }
  local_1c8 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  uVar10 = 0xf;
  if (local_1b0 != &local_1a0) {
    uVar10 = local_1a0;
  }
  if (uVar10 < (ulong)(local_1c8 + local_1a8)) {
    uVar10 = 0xf;
    if (local_1d0 != &local_1c0) {
      uVar10 = local_1c0;
    }
    if (uVar10 < (ulong)(local_1c8 + local_1a8)) goto LAB_001217ff;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,(ulong)local_1b0);
  }
  else {
LAB_001217ff:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1b0,(ulong)local_1d0);
  }
  local_250 = &local_240;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_240 = *plVar5;
    uStack_238 = puVar6[3];
  }
  else {
    local_240 = *plVar5;
    local_250 = (long *)*puVar6;
  }
  local_248 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_250);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_180 = *puVar9;
    lStack_178 = plVar5[3];
    local_190 = &local_180;
  }
  else {
    local_180 = *puVar9;
    local_190 = (ulong *)*plVar5;
  }
  local_188 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  var_to_str<int>(&local_110,(int *)(ulong)(uint)this->p0);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,0x158d05);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_1e0 = *puVar9;
    lStack_1d8 = plVar5[3];
    local_1f0 = &local_1e0;
  }
  else {
    local_1e0 = *puVar9;
    local_1f0 = (ulong *)*plVar5;
  }
  local_1e8 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  uVar10 = 0xf;
  if (local_190 != &local_180) {
    uVar10 = local_180;
  }
  if (uVar10 < (ulong)(local_1e8 + local_188)) {
    uVar10 = 0xf;
    if (local_1f0 != &local_1e0) {
      uVar10 = local_1e0;
    }
    if (uVar10 < (ulong)(local_1e8 + local_188)) goto LAB_001219ac;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1f0,0,(char *)0x0,(ulong)local_190);
  }
  else {
LAB_001219ac:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_190,(ulong)local_1f0);
  }
  local_230 = &local_220;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_220 = *plVar5;
    uStack_218 = puVar6[3];
  }
  else {
    local_220 = *plVar5;
    local_230 = (long *)*puVar6;
  }
  local_228 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_230);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_160 = *puVar9;
    lStack_158 = plVar5[3];
    local_170 = &local_160;
  }
  else {
    local_160 = *puVar9;
    local_170 = (ulong *)*plVar5;
  }
  local_168 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  var_to_str<int>(&local_130,(int *)(ulong)(uint)this->p1);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,0x158d09);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_200 = *puVar9;
    lStack_1f8 = plVar5[3];
    local_210 = &local_200;
  }
  else {
    local_200 = *puVar9;
    local_210 = (ulong *)*plVar5;
  }
  local_208 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  uVar10 = 0xf;
  if (local_170 != &local_160) {
    uVar10 = local_160;
  }
  if (uVar10 < (ulong)(local_208 + local_168)) {
    uVar10 = 0xf;
    if (local_210 != &local_200) {
      uVar10 = local_200;
    }
    if ((ulong)(local_208 + local_168) <= uVar10) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_210,0,(char *)0x0,(ulong)local_170);
      goto LAB_00121b79;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_170,(ulong)local_210);
LAB_00121b79:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar6 + 2;
  if ((size_type *)*puVar6 == psVar1) {
    uVar3 = puVar6[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar6;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar6[1];
  *puVar6 = psVar1;
  puVar6[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_210 != &local_200) {
    operator_delete(local_210,local_200 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170,local_160 + 1);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230,local_220 + 1);
  }
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0,local_1e0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190,local_180 + 1);
  }
  if (local_250 != &local_240) {
    operator_delete(local_250,local_240 + 1);
  }
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0,local_1c0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0,local_1a0 + 1);
  }
  if (local_270 != &local_260) {
    operator_delete(local_270,local_260 + 1);
  }
  if (local_410 != &local_400) {
    operator_delete(local_410,local_400 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (local_310 != &local_300) {
    operator_delete(local_310,local_300 + 1);
  }
  if (local_290 != &local_280) {
    operator_delete(local_290,local_280 + 1);
  }
  if (local_3f0 != &local_3e0) {
    operator_delete(local_3f0,local_3e0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_330 != &local_320) {
    operator_delete(local_330,local_320 + 1);
  }
  if (local_2b0 != &local_2a0) {
    operator_delete(local_2b0,local_2a0 + 1);
  }
  if (local_3d0 != &local_3c0) {
    operator_delete(local_3d0,local_3c0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_350 != &local_340) {
    operator_delete(local_350,local_340 + 1);
  }
  if (local_2d0 != &local_2c0) {
    operator_delete(local_2d0,local_2c0 + 1);
  }
  if (local_430 != &local_420) {
    operator_delete(local_430,local_420 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_370 != &local_360) {
    operator_delete(local_370,local_360 + 1);
  }
  if (local_2f0 != &local_2e0) {
    operator_delete(local_2f0,local_2e0 + 1);
  }
  if (local_3b0 != &local_3a0) {
    operator_delete(local_3b0,local_3a0 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (local_390 != &local_380) {
    operator_delete(local_390,local_380 + 1);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  if (local_450 != &local_440) {
    operator_delete(local_450,CONCAT44(uStack_43c,local_440) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string vars() override {
        return VARS_TO_STR9(pool_type, type_input, ne_input, k0, k1, s0, s1, p0, p1);
    }